

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  float y0;
  char cVar2;
  ushort uVar3;
  int iVar4;
  ImFont *pIVar5;
  ImFont **ppIVar6;
  ImFontAtlasCustomRect *pIVar7;
  long lVar8;
  int y;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ImVec2 uv1;
  ImVec2 uv0;
  ImVec2 local_40;
  ImVec2 local_38;
  
  lVar8 = (long)atlas->CustomRectIds[0];
  if (lVar8 < 0) {
    __assert_fail("atlas->CustomRectIds[0] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                  ,0x8d1,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                  ,0x8d2,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->CustomRects).Size <= atlas->CustomRectIds[0]) {
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                  ,0x52e,
                  "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]")
    ;
  }
  pIVar7 = (atlas->CustomRects).Data;
  uVar11 = (uint)pIVar7[lVar8].X;
  if (uVar11 == 0xffff) {
    __assert_fail("r.IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                  ,0x8d4,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  pIVar7 = pIVar7 + lVar8;
  iVar4 = atlas->TexWidth;
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar7->Width != 0xd9) || (pIVar7->Height != 0x1b)) {
      __assert_fail("r.Width == FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF * 2 + 1 && r.Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                    ,0x8da,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar9 = 0;
    lVar8 = 0;
    do {
      lVar12 = 0;
      do {
        cVar2 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar8 + lVar12];
        lVar13 = (long)(int)((uint)pIVar7->X + (int)lVar12 + ((uint)pIVar7->Y + iVar9) * iVar4);
        atlas->TexPixelsAlpha8[lVar13] = -(cVar2 == '.');
        atlas->TexPixelsAlpha8[lVar13 + 0x6d] = -(cVar2 == 'X');
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x6c);
      iVar9 = iVar9 + 1;
      lVar8 = (int)lVar8 + lVar12;
    } while (iVar9 != 0x1b);
  }
  else {
    if ((pIVar7->Width != 2) || (pIVar7->Height != 2)) {
      __assert_fail("r.Width == 2 && r.Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                    ,0x8e6,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar9 = (uint)pIVar7->Y * iVar4 + uVar11;
    atlas->TexPixelsAlpha8[(long)(iVar4 + iVar9) + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar4 + iVar9] = 0xff;
    atlas->TexPixelsAlpha8[(long)iVar9 + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar9] = 0xff;
  }
  uVar3 = pIVar7->Y;
  fVar1 = (atlas->TexUvScale).y;
  (atlas->TexUvWhitePixel).x = ((float)pIVar7->X + 0.5) * (atlas->TexUvScale).x;
  (atlas->TexUvWhitePixel).y = ((float)uVar3 + 0.5) * fVar1;
  if (0 < (atlas->CustomRects).Size) {
    lVar12 = 0;
    lVar8 = 0;
    do {
      pIVar7 = (atlas->CustomRects).Data;
      lVar13 = *(long *)((long)&pIVar7->Font + lVar12);
      if ((lVar13 != 0) && (*(int *)((long)&pIVar7->GlyphID + lVar12) != 0)) {
        if (*(ImFontAtlas **)(lVar13 + 0x48) != atlas) {
          __assert_fail("r.Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                        ,0x8f9,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        local_38.x = 0.0;
        local_38.y = 0.0;
        local_40.x = 0.0;
        local_40.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar7->Width + lVar12),&local_38,
                   &local_40);
        fVar1 = *(float *)((long)&(pIVar7->GlyphOffset).x + lVar12);
        y0 = *(float *)((long)&(pIVar7->GlyphOffset).y + lVar12);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar7->Font + lVar12),
                         *(ImWchar *)((long)&pIVar7->GlyphID + lVar12),fVar1,y0,
                         (float)*(ushort *)((long)&pIVar7->Width + lVar12) + fVar1,
                         (float)*(ushort *)((long)&pIVar7->Height + lVar12) + y0,local_38.x,
                         local_38.y,local_40.x,local_40.y,
                         *(float *)((long)&pIVar7->GlyphAdvanceX + lVar12));
      }
      lVar8 = lVar8 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar8 < (atlas->CustomRects).Size);
  }
  uVar11 = (atlas->Fonts).Size;
  if (0 < (int)uVar11) {
    lVar8 = 0;
    do {
      pIVar5 = (atlas->Fonts).Data[lVar8];
      if (pIVar5->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar5);
      }
      lVar8 = lVar8 + 1;
      uVar11 = (atlas->Fonts).Size;
    } while (lVar8 < (int)uVar11);
  }
  if (0 < (int)uVar11) {
    ppIVar6 = (atlas->Fonts).Data;
    uVar10 = 0;
    do {
      pIVar5 = ppIVar6[uVar10];
      if (pIVar5->EllipsisChar == 0xffff) {
        lVar8 = 0;
        do {
          uVar3 = *(ushort *)((long)&DAT_001b3cf0 + lVar8);
          if ((((ulong)uVar3 < (ulong)(long)(pIVar5->IndexLookup).Size) &&
              ((pIVar5->IndexLookup).Data[uVar3] != 0xffff)) &&
             ((pIVar5->Glyphs).Data != (ImFontGlyph *)0x0)) {
            pIVar5->EllipsisChar = uVar3;
            break;
          }
          lVar8 = lVar8 + 2;
        } while (lVar8 == 2);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar11);
  }
  return;
}

Assistant:

static void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->CustomRectIds[0] >= 0);
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL);
    ImFontAtlasCustomRect& r = atlas->CustomRects[atlas->CustomRectIds[0]];
    IM_ASSERT(r.IsPacked());

    const int w = atlas->TexWidth;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
    {
        // Render/copy pixels
        IM_ASSERT(r.Width == FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF * 2 + 1 && r.Height == FONT_ATLAS_DEFAULT_TEX_DATA_H);
        for (int y = 0, n = 0; y < FONT_ATLAS_DEFAULT_TEX_DATA_H; y++)
            for (int x = 0; x < FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF; x++, n++)
            {
                const int offset0 = (int)(r.X + x) + (int)(r.Y + y) * w;
                const int offset1 = offset0 + FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
                atlas->TexPixelsAlpha8[offset0] = FONT_ATLAS_DEFAULT_TEX_DATA_PIXELS[n] == '.' ? 0xFF : 0x00;
                atlas->TexPixelsAlpha8[offset1] = FONT_ATLAS_DEFAULT_TEX_DATA_PIXELS[n] == 'X' ? 0xFF : 0x00;
            }
    }
    else
    {
        IM_ASSERT(r.Width == 2 && r.Height == 2);
        const int offset = (int)(r.X) + (int)(r.Y) * w;
        atlas->TexPixelsAlpha8[offset] = atlas->TexPixelsAlpha8[offset + 1] = atlas->TexPixelsAlpha8[offset + w] = atlas->TexPixelsAlpha8[offset + w + 1] = 0xFF;
    }
    atlas->TexUvWhitePixel = ImVec2((r.X + 0.5f) * atlas->TexUvScale.x, (r.Y + 0.5f) * atlas->TexUvScale.y);
}